

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_setbuffer(char *args)

{
  size_t sVar1;
  char *local_10;
  char *args_local;
  
  local_10 = args;
  if (*args == '\"') {
    local_10 = args + 1;
    sVar1 = strlen(local_10);
    local_10[sVar1 - 1] = '\0';
  }
  do_buffer_size = atoi(local_10);
  if (do_buffer_size == 0) {
    printf("Further tests will NOT use a buffer.\n");
  }
  else {
    printf("Further tests will set a (%lu) size buffer.\n",(ulong)do_buffer_size);
  }
  return 1;
}

Assistant:

static int cmd_setbuffer(char *args)
{
    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    do_buffer_size = (unsigned int) atoi(args);
    if (do_buffer_size)
    {
        printf("Further tests will set a (%lu) size buffer.\n",
                (unsigned long) do_buffer_size);
    } /* if */

    else
    {
        printf("Further tests will NOT use a buffer.\n");
    } /* else */

    return 1;
}